

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::KillInstructionAndUsers
          (InterfaceVariableScalarReplacement *this,Instruction *inst)

{
  Instruction *inst_00;
  pointer def;
  bool bVar1;
  Op OVar2;
  IRContext *pIVar3;
  DefUseManager *this_00;
  reference ppIVar4;
  Instruction *user;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  function<void_(spvtools::opt::Instruction_*)> local_50;
  undefined1 local_30 [8];
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> users;
  Instruction *inst_local;
  InterfaceVariableScalarReplacement *this_local;
  
  users.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)inst;
  OVar2 = Instruction::opcode(inst);
  if (OVar2 != OpEntryPoint) {
    OVar2 = Instruction::opcode((Instruction *)
                                users.
                                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (OVar2 == OpAccessChain) {
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_30);
      pIVar3 = Pass::context(&this->super_Pass);
      this_00 = IRContext::get_def_use_mgr(pIVar3);
      def = users.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __range2 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)local_30;
      std::function<void(spvtools::opt::Instruction*)>::
      function<spvtools::opt::InterfaceVariableScalarReplacement::KillInstructionAndUsers(spvtools::opt::Instruction*)::__0,void>
                ((function<void(spvtools::opt::Instruction*)> *)&local_50,
                 (anon_class_8_1_a8c07d28 *)&__range2);
      analysis::DefUseManager::ForEachUser(this_00,(Instruction *)def,&local_50);
      std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_50);
      __end2 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)local_30);
      user = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)local_30);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                         *)&user), bVar1) {
        ppIVar4 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                  ::operator*(&__end2);
        inst_00 = *ppIVar4;
        pIVar3 = Pass::context(&this->super_Pass);
        IRContext::KillInst(pIVar3,inst_00);
        __gnu_cxx::
        __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        ::operator++(&__end2);
      }
      pIVar3 = Pass::context(&this->super_Pass);
      IRContext::KillInst(pIVar3,(Instruction *)
                                 users.
                                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )local_30);
    }
    else {
      pIVar3 = Pass::context(&this->super_Pass);
      IRContext::KillInst(pIVar3,(Instruction *)
                                 users.
                                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::KillInstructionAndUsers(
    Instruction* inst) {
  if (inst->opcode() == spv::Op::OpEntryPoint) {
    return;
  }
  if (inst->opcode() != spv::Op::OpAccessChain) {
    context()->KillInst(inst);
    return;
  }
  std::vector<Instruction*> users;
  context()->get_def_use_mgr()->ForEachUser(
      inst, [&users](Instruction* user) { users.push_back(user); });
  for (auto user : users) {
    context()->KillInst(user);
  }
  context()->KillInst(inst);
}